

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

bool __thiscall CLIntercept::initDispatch(CLIntercept *this,string *libName)

{
  Services *this_00;
  void **pLibrary;
  void *pvVar1;
  cl_api_clGetPlatformIDs p_Var2;
  cl_api_clGetPlatformInfo p_Var3;
  cl_api_clGetDeviceIDs p_Var4;
  cl_api_clGetDeviceInfo p_Var5;
  cl_api_clCreateContext p_Var6;
  cl_api_clCreateContextFromType p_Var7;
  cl_api_clRetainContext p_Var8;
  cl_api_clReleaseContext p_Var9;
  cl_api_clGetContextInfo p_Var10;
  cl_api_clCreateCommandQueue p_Var11;
  cl_api_clRetainCommandQueue p_Var12;
  cl_api_clReleaseCommandQueue p_Var13;
  cl_api_clGetCommandQueueInfo p_Var14;
  cl_api_clSetCommandQueueProperty p_Var15;
  cl_api_clCreateBuffer p_Var16;
  cl_api_clCreateImage2D p_Var17;
  cl_api_clCreateImage3D p_Var18;
  cl_api_clRetainMemObject p_Var19;
  cl_api_clReleaseMemObject p_Var20;
  cl_api_clGetSupportedImageFormats p_Var21;
  cl_api_clGetMemObjectInfo p_Var22;
  cl_api_clGetImageInfo p_Var23;
  cl_api_clCreateSampler p_Var24;
  cl_api_clRetainSampler p_Var25;
  cl_api_clReleaseSampler p_Var26;
  cl_api_clGetSamplerInfo p_Var27;
  cl_api_clCreateProgramWithSource p_Var28;
  cl_api_clCreateProgramWithBinary p_Var29;
  cl_api_clRetainProgram p_Var30;
  cl_api_clReleaseProgram p_Var31;
  cl_api_clBuildProgram p_Var32;
  cl_api_clUnloadCompiler p_Var33;
  cl_api_clGetProgramInfo p_Var34;
  cl_api_clGetProgramBuildInfo p_Var35;
  cl_api_clCreateKernel p_Var36;
  cl_api_clCreateKernelsInProgram p_Var37;
  cl_api_clRetainKernel p_Var38;
  cl_api_clReleaseKernel p_Var39;
  cl_api_clSetKernelArg p_Var40;
  cl_api_clGetKernelInfo p_Var41;
  cl_api_clGetKernelWorkGroupInfo p_Var42;
  cl_api_clWaitForEvents p_Var43;
  cl_api_clGetEventInfo p_Var44;
  cl_api_clRetainEvent p_Var45;
  cl_api_clReleaseEvent p_Var46;
  cl_api_clGetEventProfilingInfo p_Var47;
  cl_api_clFlush p_Var48;
  cl_api_clFinish p_Var49;
  cl_api_clEnqueueReadBuffer p_Var50;
  cl_api_clEnqueueWriteBuffer p_Var51;
  cl_api_clEnqueueCopyBuffer p_Var52;
  cl_api_clEnqueueReadImage p_Var53;
  cl_api_clEnqueueWriteImage p_Var54;
  cl_api_clEnqueueCopyImage p_Var55;
  cl_api_clEnqueueCopyImageToBuffer p_Var56;
  cl_api_clEnqueueCopyBufferToImage p_Var57;
  cl_api_clEnqueueMapBuffer p_Var58;
  cl_api_clEnqueueMapImage p_Var59;
  cl_api_clEnqueueUnmapMemObject p_Var60;
  cl_api_clEnqueueNDRangeKernel p_Var61;
  cl_api_clEnqueueTask p_Var62;
  cl_api_clEnqueueNativeKernel p_Var63;
  cl_api_clEnqueueMarker p_Var64;
  cl_api_clEnqueueWaitForEvents p_Var65;
  cl_api_clEnqueueBarrier p_Var66;
  cl_api_clGetExtensionFunctionAddress p_Var67;
  cl_api_clGetGLContextInfoKHR p_Var68;
  cl_api_clCreateFromGLBuffer p_Var69;
  cl_api_clCreateFromGLTexture p_Var70;
  cl_api_clCreateFromGLTexture2D p_Var71;
  cl_api_clCreateFromGLTexture3D p_Var72;
  cl_api_clCreateFromGLRenderbuffer p_Var73;
  cl_api_clGetGLObjectInfo p_Var74;
  cl_api_clGetGLTextureInfo p_Var75;
  cl_api_clEnqueueAcquireGLObjects p_Var76;
  cl_api_clEnqueueReleaseGLObjects p_Var77;
  cl_api_clSetEventCallback p_Var78;
  cl_api_clCreateSubBuffer p_Var79;
  cl_api_clSetMemObjectDestructorCallback p_Var80;
  cl_api_clCreateUserEvent p_Var81;
  cl_api_clSetUserEventStatus p_Var82;
  cl_api_clEnqueueReadBufferRect p_Var83;
  cl_api_clEnqueueWriteBufferRect p_Var84;
  cl_api_clEnqueueCopyBufferRect p_Var85;
  cl_api_clCreateSubDevices p_Var86;
  cl_api_clRetainDevice p_Var87;
  cl_api_clReleaseDevice p_Var88;
  cl_api_clCreateImage p_Var89;
  cl_api_clCreateProgramWithBuiltInKernels p_Var90;
  cl_api_clCompileProgram p_Var91;
  cl_api_clLinkProgram p_Var92;
  cl_api_clUnloadPlatformCompiler p_Var93;
  cl_api_clGetKernelArgInfo p_Var94;
  cl_api_clEnqueueFillBuffer p_Var95;
  cl_api_clEnqueueFillImage p_Var96;
  cl_api_clEnqueueMigrateMemObjects p_Var97;
  cl_api_clEnqueueMarkerWithWaitList p_Var98;
  cl_api_clEnqueueBarrierWithWaitList p_Var99;
  cl_api_clGetExtensionFunctionAddressForPlatform p_Var100;
  cl_api_clCreateCommandQueueWithProperties p_Var101;
  cl_api_clCreatePipe p_Var102;
  cl_api_clGetPipeInfo p_Var103;
  cl_api_clSVMAlloc p_Var104;
  cl_api_clSVMFree p_Var105;
  cl_api_clEnqueueSVMFree p_Var106;
  cl_api_clEnqueueSVMMemcpy p_Var107;
  cl_api_clEnqueueSVMMemFill p_Var108;
  cl_api_clEnqueueSVMMap p_Var109;
  cl_api_clEnqueueSVMUnmap p_Var110;
  cl_api_clCreateSamplerWithProperties p_Var111;
  cl_api_clSetKernelArgSVMPointer p_Var112;
  cl_api_clSetKernelExecInfo p_Var113;
  cl_api_clCloneKernel p_Var114;
  cl_api_clCreateProgramWithIL p_Var115;
  cl_api_clEnqueueSVMMigrateMem p_Var116;
  cl_api_clGetDeviceAndHostTimer p_Var117;
  cl_api_clGetHostTimer p_Var118;
  cl_api_clGetKernelSubGroupInfo p_Var119;
  cl_api_clSetDefaultDeviceCommandQueue p_Var120;
  cl_api_clSetProgramReleaseCallback p_Var121;
  cl_api_clSetProgramSpecializationConstant p_Var122;
  cl_api_clCreateBufferWithProperties p_Var123;
  cl_api_clCreateImageWithProperties p_Var124;
  cl_api_clSetContextDestructorCallback p_Var125;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  double __x_04;
  double __x_05;
  double __x_06;
  double __x_07;
  double __x_08;
  double __x_09;
  double __x_10;
  double __x_11;
  double __x_12;
  double __x_13;
  double __x_14;
  double __x_15;
  double __x_16;
  double __x_17;
  double __x_18;
  double __x_19;
  double __x_20;
  double __x_21;
  double __x_22;
  double __x_23;
  double __x_24;
  double __x_25;
  double __x_26;
  double __x_27;
  double __x_28;
  double __x_29;
  double __x_30;
  double __x_31;
  double __x_32;
  double __x_33;
  double __x_34;
  double __x_35;
  double __x_36;
  double __x_37;
  double __x_38;
  double __x_39;
  double __x_40;
  double __x_41;
  double __x_42;
  double __x_43;
  double __x_44;
  double __x_45;
  double __x_46;
  double __x_47;
  double __x_48;
  double __x_49;
  double __x_50;
  double __x_51;
  double __x_52;
  double __x_53;
  double __x_54;
  double __x_55;
  double __x_56;
  double __x_57;
  double __x_58;
  double __x_59;
  double __x_60;
  double __x_61;
  double __x_62;
  double __x_63;
  double __x_64;
  double __x_65;
  double __x_66;
  double __x_67;
  double __x_68;
  double __x_69;
  double __x_70;
  double __x_71;
  double __x_72;
  double __x_73;
  double __x_74;
  double __x_75;
  double __x_76;
  double __x_77;
  double __x_78;
  double __x_79;
  double __x_80;
  double __x_81;
  double __x_82;
  double __x_83;
  double __x_84;
  double __x_85;
  double __x_86;
  double __x_87;
  double __x_88;
  double __x_89;
  double __x_90;
  double __x_91;
  double __x_92;
  double __x_93;
  double __x_94;
  double __x_95;
  double __x_96;
  double __x_97;
  double __x_98;
  double __x_99;
  double __x_x00100;
  double __x_x00101;
  double __x_x00102;
  double __x_x00103;
  double __x_x00104;
  double __x_x00105;
  double __x_x00106;
  double __x_x00107;
  double __x_x00108;
  double __x_x00109;
  double __x_x00110;
  double __x_x00111;
  double __x_x00112;
  double __x_x00113;
  double __x_x00114;
  double __x_x00115;
  double __x_x00116;
  double __x_x00117;
  double __x_x00118;
  double __x_x00119;
  double __x_x00120;
  double __x_x00121;
  double __x_x00122;
  double __x_x00123;
  allocator local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string
            ((string *)&local_70,(libName->_M_dataplus)._M_p,(allocator *)&local_90);
  pvVar1 = (void *)dlopen(local_70._M_dataplus._M_p,0x102);
  pLibrary = &this->m_OpenCLLibraryHandle;
  this->m_OpenCLLibraryHandle = pvVar1;
  std::__cxx11::string::~string((string *)&local_70);
  pvVar1 = this->m_OpenCLLibraryHandle;
  if (pvVar1 == (void *)0x0) {
    std::__cxx11::string::string((string *)&local_50,"Couldn\'t load library: ",&local_91);
    std::operator+(&local_90,&local_50,libName);
    std::operator+(&local_70,&local_90,"\n");
    log(this,__x);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    this_00 = &this->m_OS;
    std::__cxx11::string::string((string *)&local_70,"clGetPlatformIDs",(allocator *)&local_90);
    p_Var2 = (cl_api_clGetPlatformIDs)
             OS::Services_Common::GetFunctionPointer
                       (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var2 == (cl_api_clGetPlatformIDs)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clGetPlatformIDs");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_00);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clGetPlatformIDs = p_Var2;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clGetPlatformInfo",(allocator *)&local_90);
    p_Var3 = (cl_api_clGetPlatformInfo)
             OS::Services_Common::GetFunctionPointer
                       (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var3 == (cl_api_clGetPlatformInfo)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clGetPlatformInfo");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_01);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clGetPlatformInfo = p_Var3;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clGetDeviceIDs",(allocator *)&local_90);
    p_Var4 = (cl_api_clGetDeviceIDs)
             OS::Services_Common::GetFunctionPointer
                       (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var4 == (cl_api_clGetDeviceIDs)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clGetDeviceIDs");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_02);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clGetDeviceIDs = p_Var4;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clGetDeviceInfo",(allocator *)&local_90);
    p_Var5 = (cl_api_clGetDeviceInfo)
             OS::Services_Common::GetFunctionPointer
                       (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var5 == (cl_api_clGetDeviceInfo)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clGetDeviceInfo");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_03);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clGetDeviceInfo = p_Var5;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clCreateContext",(allocator *)&local_90);
    p_Var6 = (cl_api_clCreateContext)
             OS::Services_Common::GetFunctionPointer
                       (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var6 == (cl_api_clCreateContext)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clCreateContext");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_04);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clCreateContext = p_Var6;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string
              ((string *)&local_70,"clCreateContextFromType",(allocator *)&local_90);
    p_Var7 = (cl_api_clCreateContextFromType)
             OS::Services_Common::GetFunctionPointer
                       (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var7 == (cl_api_clCreateContextFromType)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clCreateContextFromType");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_05);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clCreateContextFromType = p_Var7;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clRetainContext",(allocator *)&local_90);
    p_Var8 = (cl_api_clRetainContext)
             OS::Services_Common::GetFunctionPointer
                       (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var8 == (cl_api_clRetainContext)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clRetainContext");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_06);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clRetainContext = p_Var8;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clReleaseContext",(allocator *)&local_90);
    p_Var9 = (cl_api_clReleaseContext)
             OS::Services_Common::GetFunctionPointer
                       (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var9 == (cl_api_clReleaseContext)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clReleaseContext");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_07);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clReleaseContext = p_Var9;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clGetContextInfo",(allocator *)&local_90);
    p_Var10 = (cl_api_clGetContextInfo)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var10 == (cl_api_clGetContextInfo)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clGetContextInfo");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_08);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clGetContextInfo = p_Var10;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clCreateCommandQueue",(allocator *)&local_90);
    p_Var11 = (cl_api_clCreateCommandQueue)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var11 == (cl_api_clCreateCommandQueue)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clCreateCommandQueue");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_09);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clCreateCommandQueue = p_Var11;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clRetainCommandQueue",(allocator *)&local_90);
    p_Var12 = (cl_api_clRetainCommandQueue)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var12 == (cl_api_clRetainCommandQueue)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clRetainCommandQueue");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_10);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clRetainCommandQueue = p_Var12;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clReleaseCommandQueue",(allocator *)&local_90)
    ;
    p_Var13 = (cl_api_clReleaseCommandQueue)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var13 == (cl_api_clReleaseCommandQueue)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clReleaseCommandQueue");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_11);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clReleaseCommandQueue = p_Var13;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clGetCommandQueueInfo",(allocator *)&local_90)
    ;
    p_Var14 = (cl_api_clGetCommandQueueInfo)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var14 == (cl_api_clGetCommandQueueInfo)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clGetCommandQueueInfo");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_12);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clGetCommandQueueInfo = p_Var14;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string
              ((string *)&local_70,"clSetCommandQueueProperty",(allocator *)&local_90);
    p_Var15 = (cl_api_clSetCommandQueueProperty)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var15 == (cl_api_clSetCommandQueueProperty)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clSetCommandQueueProperty");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_13);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clSetCommandQueueProperty = p_Var15;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clCreateBuffer",(allocator *)&local_90);
    p_Var16 = (cl_api_clCreateBuffer)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var16 == (cl_api_clCreateBuffer)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clCreateBuffer");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_14);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clCreateBuffer = p_Var16;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clCreateImage2D",(allocator *)&local_90);
    p_Var17 = (cl_api_clCreateImage2D)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var17 == (cl_api_clCreateImage2D)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clCreateImage2D");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_15);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clCreateImage2D = p_Var17;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clCreateImage3D",(allocator *)&local_90);
    p_Var18 = (cl_api_clCreateImage3D)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var18 == (cl_api_clCreateImage3D)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clCreateImage3D");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_16);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clCreateImage3D = p_Var18;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clRetainMemObject",(allocator *)&local_90);
    p_Var19 = (cl_api_clRetainMemObject)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var19 == (cl_api_clRetainMemObject)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clRetainMemObject");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_17);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clRetainMemObject = p_Var19;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clReleaseMemObject",(allocator *)&local_90);
    p_Var20 = (cl_api_clReleaseMemObject)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var20 == (cl_api_clReleaseMemObject)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clReleaseMemObject");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_18);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clReleaseMemObject = p_Var20;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string
              ((string *)&local_70,"clGetSupportedImageFormats",(allocator *)&local_90);
    p_Var21 = (cl_api_clGetSupportedImageFormats)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var21 == (cl_api_clGetSupportedImageFormats)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clGetSupportedImageFormats");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_19);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clGetSupportedImageFormats = p_Var21;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clGetMemObjectInfo",(allocator *)&local_90);
    p_Var22 = (cl_api_clGetMemObjectInfo)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var22 == (cl_api_clGetMemObjectInfo)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clGetMemObjectInfo");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_20);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clGetMemObjectInfo = p_Var22;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clGetImageInfo",(allocator *)&local_90);
    p_Var23 = (cl_api_clGetImageInfo)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var23 == (cl_api_clGetImageInfo)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clGetImageInfo");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_21);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clGetImageInfo = p_Var23;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clCreateSampler",(allocator *)&local_90);
    p_Var24 = (cl_api_clCreateSampler)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var24 == (cl_api_clCreateSampler)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clCreateSampler");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_22);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clCreateSampler = p_Var24;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clRetainSampler",(allocator *)&local_90);
    p_Var25 = (cl_api_clRetainSampler)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var25 == (cl_api_clRetainSampler)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clRetainSampler");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_23);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clRetainSampler = p_Var25;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clReleaseSampler",(allocator *)&local_90);
    p_Var26 = (cl_api_clReleaseSampler)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var26 == (cl_api_clReleaseSampler)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clReleaseSampler");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_24);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clReleaseSampler = p_Var26;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clGetSamplerInfo",(allocator *)&local_90);
    p_Var27 = (cl_api_clGetSamplerInfo)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var27 == (cl_api_clGetSamplerInfo)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clGetSamplerInfo");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_25);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clGetSamplerInfo = p_Var27;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string
              ((string *)&local_70,"clCreateProgramWithSource",(allocator *)&local_90);
    p_Var28 = (cl_api_clCreateProgramWithSource)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var28 == (cl_api_clCreateProgramWithSource)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clCreateProgramWithSource");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_26);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clCreateProgramWithSource = p_Var28;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string
              ((string *)&local_70,"clCreateProgramWithBinary",(allocator *)&local_90);
    p_Var29 = (cl_api_clCreateProgramWithBinary)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var29 == (cl_api_clCreateProgramWithBinary)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clCreateProgramWithBinary");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_27);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clCreateProgramWithBinary = p_Var29;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clRetainProgram",(allocator *)&local_90);
    p_Var30 = (cl_api_clRetainProgram)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var30 == (cl_api_clRetainProgram)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clRetainProgram");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_28);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clRetainProgram = p_Var30;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clReleaseProgram",(allocator *)&local_90);
    p_Var31 = (cl_api_clReleaseProgram)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var31 == (cl_api_clReleaseProgram)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clReleaseProgram");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_29);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clReleaseProgram = p_Var31;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clBuildProgram",(allocator *)&local_90);
    p_Var32 = (cl_api_clBuildProgram)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var32 == (cl_api_clBuildProgram)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clBuildProgram");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_30);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clBuildProgram = p_Var32;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clUnloadCompiler",(allocator *)&local_90);
    p_Var33 = (cl_api_clUnloadCompiler)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var33 == (cl_api_clUnloadCompiler)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clUnloadCompiler");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_31);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clUnloadCompiler = p_Var33;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clGetProgramInfo",(allocator *)&local_90);
    p_Var34 = (cl_api_clGetProgramInfo)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var34 == (cl_api_clGetProgramInfo)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clGetProgramInfo");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_32);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clGetProgramInfo = p_Var34;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clGetProgramBuildInfo",(allocator *)&local_90)
    ;
    p_Var35 = (cl_api_clGetProgramBuildInfo)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var35 == (cl_api_clGetProgramBuildInfo)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clGetProgramBuildInfo");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_33);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clGetProgramBuildInfo = p_Var35;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clCreateKernel",(allocator *)&local_90);
    p_Var36 = (cl_api_clCreateKernel)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var36 == (cl_api_clCreateKernel)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clCreateKernel");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_34);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clCreateKernel = p_Var36;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string
              ((string *)&local_70,"clCreateKernelsInProgram",(allocator *)&local_90);
    p_Var37 = (cl_api_clCreateKernelsInProgram)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var37 == (cl_api_clCreateKernelsInProgram)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clCreateKernelsInProgram");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_35);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clCreateKernelsInProgram = p_Var37;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clRetainKernel",(allocator *)&local_90);
    p_Var38 = (cl_api_clRetainKernel)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var38 == (cl_api_clRetainKernel)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clRetainKernel");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_36);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clRetainKernel = p_Var38;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clReleaseKernel",(allocator *)&local_90);
    p_Var39 = (cl_api_clReleaseKernel)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var39 == (cl_api_clReleaseKernel)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clReleaseKernel");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_37);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clReleaseKernel = p_Var39;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clSetKernelArg",(allocator *)&local_90);
    p_Var40 = (cl_api_clSetKernelArg)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var40 == (cl_api_clSetKernelArg)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clSetKernelArg");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_38);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clSetKernelArg = p_Var40;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clGetKernelInfo",(allocator *)&local_90);
    p_Var41 = (cl_api_clGetKernelInfo)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var41 == (cl_api_clGetKernelInfo)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clGetKernelInfo");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_39);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clGetKernelInfo = p_Var41;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string
              ((string *)&local_70,"clGetKernelWorkGroupInfo",(allocator *)&local_90);
    p_Var42 = (cl_api_clGetKernelWorkGroupInfo)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var42 == (cl_api_clGetKernelWorkGroupInfo)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clGetKernelWorkGroupInfo");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_40);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clGetKernelWorkGroupInfo = p_Var42;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clWaitForEvents",(allocator *)&local_90);
    p_Var43 = (cl_api_clWaitForEvents)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var43 == (cl_api_clWaitForEvents)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clWaitForEvents");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_41);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clWaitForEvents = p_Var43;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clGetEventInfo",(allocator *)&local_90);
    p_Var44 = (cl_api_clGetEventInfo)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var44 == (cl_api_clGetEventInfo)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clGetEventInfo");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_42);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clGetEventInfo = p_Var44;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clRetainEvent",(allocator *)&local_90);
    p_Var45 = (cl_api_clRetainEvent)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var45 == (cl_api_clRetainEvent)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clRetainEvent");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_43);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clRetainEvent = p_Var45;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clReleaseEvent",(allocator *)&local_90);
    p_Var46 = (cl_api_clReleaseEvent)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var46 == (cl_api_clReleaseEvent)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clReleaseEvent");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_44);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clReleaseEvent = p_Var46;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string
              ((string *)&local_70,"clGetEventProfilingInfo",(allocator *)&local_90);
    p_Var47 = (cl_api_clGetEventProfilingInfo)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var47 == (cl_api_clGetEventProfilingInfo)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clGetEventProfilingInfo");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_45);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clGetEventProfilingInfo = p_Var47;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clFlush",(allocator *)&local_90);
    p_Var48 = (cl_api_clFlush)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var48 == (cl_api_clFlush)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clFlush");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_46);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clFlush = p_Var48;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clFinish",(allocator *)&local_90);
    p_Var49 = (cl_api_clFinish)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var49 == (cl_api_clFinish)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clFinish");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_47);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clFinish = p_Var49;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clEnqueueReadBuffer",(allocator *)&local_90);
    p_Var50 = (cl_api_clEnqueueReadBuffer)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var50 == (cl_api_clEnqueueReadBuffer)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clEnqueueReadBuffer");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_48);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clEnqueueReadBuffer = p_Var50;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clEnqueueWriteBuffer",(allocator *)&local_90);
    p_Var51 = (cl_api_clEnqueueWriteBuffer)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var51 == (cl_api_clEnqueueWriteBuffer)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clEnqueueWriteBuffer");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_49);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clEnqueueWriteBuffer = p_Var51;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clEnqueueCopyBuffer",(allocator *)&local_90);
    p_Var52 = (cl_api_clEnqueueCopyBuffer)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var52 == (cl_api_clEnqueueCopyBuffer)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clEnqueueCopyBuffer");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clEnqueueCopyBuffer = p_Var52;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clEnqueueReadImage",(allocator *)&local_90);
    p_Var53 = (cl_api_clEnqueueReadImage)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var53 == (cl_api_clEnqueueReadImage)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clEnqueueReadImage");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_51);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clEnqueueReadImage = p_Var53;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clEnqueueWriteImage",(allocator *)&local_90);
    p_Var54 = (cl_api_clEnqueueWriteImage)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var54 == (cl_api_clEnqueueWriteImage)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clEnqueueWriteImage");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_52);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clEnqueueWriteImage = p_Var54;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clEnqueueCopyImage",(allocator *)&local_90);
    p_Var55 = (cl_api_clEnqueueCopyImage)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var55 == (cl_api_clEnqueueCopyImage)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clEnqueueCopyImage");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_53);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clEnqueueCopyImage = p_Var55;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string
              ((string *)&local_70,"clEnqueueCopyImageToBuffer",(allocator *)&local_90);
    p_Var56 = (cl_api_clEnqueueCopyImageToBuffer)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var56 == (cl_api_clEnqueueCopyImageToBuffer)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clEnqueueCopyImageToBuffer");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_54);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clEnqueueCopyImageToBuffer = p_Var56;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string
              ((string *)&local_70,"clEnqueueCopyBufferToImage",(allocator *)&local_90);
    p_Var57 = (cl_api_clEnqueueCopyBufferToImage)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var57 == (cl_api_clEnqueueCopyBufferToImage)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clEnqueueCopyBufferToImage");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_55);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clEnqueueCopyBufferToImage = p_Var57;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clEnqueueMapBuffer",(allocator *)&local_90);
    p_Var58 = (cl_api_clEnqueueMapBuffer)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var58 == (cl_api_clEnqueueMapBuffer)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clEnqueueMapBuffer");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_56);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clEnqueueMapBuffer = p_Var58;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clEnqueueMapImage",(allocator *)&local_90);
    p_Var59 = (cl_api_clEnqueueMapImage)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var59 == (cl_api_clEnqueueMapImage)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clEnqueueMapImage");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_57);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clEnqueueMapImage = p_Var59;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string
              ((string *)&local_70,"clEnqueueUnmapMemObject",(allocator *)&local_90);
    p_Var60 = (cl_api_clEnqueueUnmapMemObject)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var60 == (cl_api_clEnqueueUnmapMemObject)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clEnqueueUnmapMemObject");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_58);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clEnqueueUnmapMemObject = p_Var60;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string
              ((string *)&local_70,"clEnqueueNDRangeKernel",(allocator *)&local_90);
    p_Var61 = (cl_api_clEnqueueNDRangeKernel)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var61 == (cl_api_clEnqueueNDRangeKernel)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clEnqueueNDRangeKernel");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_59);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clEnqueueNDRangeKernel = p_Var61;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clEnqueueTask",(allocator *)&local_90);
    p_Var62 = (cl_api_clEnqueueTask)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var62 == (cl_api_clEnqueueTask)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clEnqueueTask");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_60);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clEnqueueTask = p_Var62;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clEnqueueNativeKernel",(allocator *)&local_90)
    ;
    p_Var63 = (cl_api_clEnqueueNativeKernel)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var63 == (cl_api_clEnqueueNativeKernel)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clEnqueueNativeKernel");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_61);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clEnqueueNativeKernel = p_Var63;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clEnqueueMarker",(allocator *)&local_90);
    p_Var64 = (cl_api_clEnqueueMarker)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var64 == (cl_api_clEnqueueMarker)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clEnqueueMarker");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_62);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clEnqueueMarker = p_Var64;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string
              ((string *)&local_70,"clEnqueueWaitForEvents",(allocator *)&local_90);
    p_Var65 = (cl_api_clEnqueueWaitForEvents)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var65 == (cl_api_clEnqueueWaitForEvents)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clEnqueueWaitForEvents");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_63);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clEnqueueWaitForEvents = p_Var65;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clEnqueueBarrier",(allocator *)&local_90);
    p_Var66 = (cl_api_clEnqueueBarrier)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var66 == (cl_api_clEnqueueBarrier)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clEnqueueBarrier");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_64);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clEnqueueBarrier = p_Var66;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string
              ((string *)&local_70,"clGetExtensionFunctionAddress",(allocator *)&local_90);
    p_Var67 = (cl_api_clGetExtensionFunctionAddress)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var67 == (cl_api_clGetExtensionFunctionAddress)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clGetExtensionFunctionAddress");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_65);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clGetExtensionFunctionAddress = p_Var67;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clGetGLContextInfoKHR",(allocator *)&local_90)
    ;
    p_Var68 = (cl_api_clGetGLContextInfoKHR)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var68 == (cl_api_clGetGLContextInfoKHR)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clGetGLContextInfoKHR");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_66);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clGetGLContextInfoKHR = p_Var68;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clCreateFromGLBuffer",(allocator *)&local_90);
    p_Var69 = (cl_api_clCreateFromGLBuffer)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var69 == (cl_api_clCreateFromGLBuffer)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clCreateFromGLBuffer");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_67);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clCreateFromGLBuffer = p_Var69;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clCreateFromGLTexture",(allocator *)&local_90)
    ;
    p_Var70 = (cl_api_clCreateFromGLTexture)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var70 == (cl_api_clCreateFromGLTexture)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clCreateFromGLTexture");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_68);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clCreateFromGLTexture = p_Var70;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string
              ((string *)&local_70,"clCreateFromGLTexture2D",(allocator *)&local_90);
    p_Var71 = (cl_api_clCreateFromGLTexture2D)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var71 == (cl_api_clCreateFromGLTexture2D)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clCreateFromGLTexture2D");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_69);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clCreateFromGLTexture2D = p_Var71;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string
              ((string *)&local_70,"clCreateFromGLTexture3D",(allocator *)&local_90);
    p_Var72 = (cl_api_clCreateFromGLTexture3D)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var72 == (cl_api_clCreateFromGLTexture3D)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clCreateFromGLTexture3D");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clCreateFromGLTexture3D = p_Var72;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string
              ((string *)&local_70,"clCreateFromGLRenderbuffer",(allocator *)&local_90);
    p_Var73 = (cl_api_clCreateFromGLRenderbuffer)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var73 == (cl_api_clCreateFromGLRenderbuffer)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clCreateFromGLRenderbuffer");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_71);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clCreateFromGLRenderbuffer = p_Var73;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clGetGLObjectInfo",(allocator *)&local_90);
    p_Var74 = (cl_api_clGetGLObjectInfo)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var74 == (cl_api_clGetGLObjectInfo)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clGetGLObjectInfo");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_72);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clGetGLObjectInfo = p_Var74;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clGetGLTextureInfo",(allocator *)&local_90);
    p_Var75 = (cl_api_clGetGLTextureInfo)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var75 == (cl_api_clGetGLTextureInfo)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clGetGLTextureInfo");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_73);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clGetGLTextureInfo = p_Var75;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string
              ((string *)&local_70,"clEnqueueAcquireGLObjects",(allocator *)&local_90);
    p_Var76 = (cl_api_clEnqueueAcquireGLObjects)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var76 == (cl_api_clEnqueueAcquireGLObjects)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clEnqueueAcquireGLObjects");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_74);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clEnqueueAcquireGLObjects = p_Var76;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string
              ((string *)&local_70,"clEnqueueReleaseGLObjects",(allocator *)&local_90);
    p_Var77 = (cl_api_clEnqueueReleaseGLObjects)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var77 == (cl_api_clEnqueueReleaseGLObjects)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clEnqueueReleaseGLObjects");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_75);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clEnqueueReleaseGLObjects = p_Var77;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clSetEventCallback",(allocator *)&local_90);
    p_Var78 = (cl_api_clSetEventCallback)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var78 == (cl_api_clSetEventCallback)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clSetEventCallback");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_76);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clSetEventCallback = p_Var78;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clCreateSubBuffer",(allocator *)&local_90);
    p_Var79 = (cl_api_clCreateSubBuffer)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var79 == (cl_api_clCreateSubBuffer)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clCreateSubBuffer");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_77);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clCreateSubBuffer = p_Var79;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string
              ((string *)&local_70,"clSetMemObjectDestructorCallback",(allocator *)&local_90);
    p_Var80 = (cl_api_clSetMemObjectDestructorCallback)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var80 == (cl_api_clSetMemObjectDestructorCallback)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clSetMemObjectDestructorCallback");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_78);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clSetMemObjectDestructorCallback = p_Var80;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clCreateUserEvent",(allocator *)&local_90);
    p_Var81 = (cl_api_clCreateUserEvent)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var81 == (cl_api_clCreateUserEvent)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clCreateUserEvent");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_79);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clCreateUserEvent = p_Var81;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clSetUserEventStatus",(allocator *)&local_90);
    p_Var82 = (cl_api_clSetUserEventStatus)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var82 == (cl_api_clSetUserEventStatus)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clSetUserEventStatus");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_80);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clSetUserEventStatus = p_Var82;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string
              ((string *)&local_70,"clEnqueueReadBufferRect",(allocator *)&local_90);
    p_Var83 = (cl_api_clEnqueueReadBufferRect)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var83 == (cl_api_clEnqueueReadBufferRect)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clEnqueueReadBufferRect");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_81);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clEnqueueReadBufferRect = p_Var83;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string
              ((string *)&local_70,"clEnqueueWriteBufferRect",(allocator *)&local_90);
    p_Var84 = (cl_api_clEnqueueWriteBufferRect)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var84 == (cl_api_clEnqueueWriteBufferRect)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clEnqueueWriteBufferRect");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_82);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clEnqueueWriteBufferRect = p_Var84;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string
              ((string *)&local_70,"clEnqueueCopyBufferRect",(allocator *)&local_90);
    p_Var85 = (cl_api_clEnqueueCopyBufferRect)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var85 == (cl_api_clEnqueueCopyBufferRect)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clEnqueueCopyBufferRect");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_83);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clEnqueueCopyBufferRect = p_Var85;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clCreateSubDevices",(allocator *)&local_90);
    p_Var86 = (cl_api_clCreateSubDevices)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var86 == (cl_api_clCreateSubDevices)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clCreateSubDevices");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_84);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clCreateSubDevices = p_Var86;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clRetainDevice",(allocator *)&local_90);
    p_Var87 = (cl_api_clRetainDevice)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var87 == (cl_api_clRetainDevice)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clRetainDevice");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_85);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clRetainDevice = p_Var87;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clReleaseDevice",(allocator *)&local_90);
    p_Var88 = (cl_api_clReleaseDevice)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var88 == (cl_api_clReleaseDevice)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clReleaseDevice");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_86);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clReleaseDevice = p_Var88;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clCreateImage",(allocator *)&local_90);
    p_Var89 = (cl_api_clCreateImage)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var89 == (cl_api_clCreateImage)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clCreateImage");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_87);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clCreateImage = p_Var89;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string
              ((string *)&local_70,"clCreateProgramWithBuiltInKernels",(allocator *)&local_90);
    p_Var90 = (cl_api_clCreateProgramWithBuiltInKernels)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var90 == (cl_api_clCreateProgramWithBuiltInKernels)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clCreateProgramWithBuiltInKernels");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_88);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clCreateProgramWithBuiltInKernels = p_Var90;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clCompileProgram",(allocator *)&local_90);
    p_Var91 = (cl_api_clCompileProgram)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var91 == (cl_api_clCompileProgram)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clCompileProgram");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_89);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clCompileProgram = p_Var91;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clLinkProgram",(allocator *)&local_90);
    p_Var92 = (cl_api_clLinkProgram)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var92 == (cl_api_clLinkProgram)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clLinkProgram");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_90);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clLinkProgram = p_Var92;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string
              ((string *)&local_70,"clUnloadPlatformCompiler",(allocator *)&local_90);
    p_Var93 = (cl_api_clUnloadPlatformCompiler)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var93 == (cl_api_clUnloadPlatformCompiler)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clUnloadPlatformCompiler");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_91);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clUnloadPlatformCompiler = p_Var93;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clGetKernelArgInfo",(allocator *)&local_90);
    p_Var94 = (cl_api_clGetKernelArgInfo)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var94 == (cl_api_clGetKernelArgInfo)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clGetKernelArgInfo");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_92);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clGetKernelArgInfo = p_Var94;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clEnqueueFillBuffer",(allocator *)&local_90);
    p_Var95 = (cl_api_clEnqueueFillBuffer)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var95 == (cl_api_clEnqueueFillBuffer)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clEnqueueFillBuffer");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_93);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clEnqueueFillBuffer = p_Var95;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clEnqueueFillImage",(allocator *)&local_90);
    p_Var96 = (cl_api_clEnqueueFillImage)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var96 == (cl_api_clEnqueueFillImage)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clEnqueueFillImage");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_94);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clEnqueueFillImage = p_Var96;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string
              ((string *)&local_70,"clEnqueueMigrateMemObjects",(allocator *)&local_90);
    p_Var97 = (cl_api_clEnqueueMigrateMemObjects)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var97 == (cl_api_clEnqueueMigrateMemObjects)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clEnqueueMigrateMemObjects");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_95);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clEnqueueMigrateMemObjects = p_Var97;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string
              ((string *)&local_70,"clEnqueueMarkerWithWaitList",(allocator *)&local_90);
    p_Var98 = (cl_api_clEnqueueMarkerWithWaitList)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var98 == (cl_api_clEnqueueMarkerWithWaitList)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clEnqueueMarkerWithWaitList");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_96);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clEnqueueMarkerWithWaitList = p_Var98;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string
              ((string *)&local_70,"clEnqueueBarrierWithWaitList",(allocator *)&local_90);
    p_Var99 = (cl_api_clEnqueueBarrierWithWaitList)
              OS::Services_Common::GetFunctionPointer
                        (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var99 == (cl_api_clEnqueueBarrierWithWaitList)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clEnqueueBarrierWithWaitList");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_97);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clEnqueueBarrierWithWaitList = p_Var99;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string
              ((string *)&local_70,"clGetExtensionFunctionAddressForPlatform",(allocator *)&local_90
              );
    p_Var100 = (cl_api_clGetExtensionFunctionAddressForPlatform)
               OS::Services_Common::GetFunctionPointer
                         (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var100 == (cl_api_clGetExtensionFunctionAddressForPlatform)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clGetExtensionFunctionAddressForPlatform");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_98);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clGetExtensionFunctionAddressForPlatform = p_Var100;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string
              ((string *)&local_70,"clCreateCommandQueueWithProperties",(allocator *)&local_90);
    p_Var101 = (cl_api_clCreateCommandQueueWithProperties)
               OS::Services_Common::GetFunctionPointer
                         (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var101 == (cl_api_clCreateCommandQueueWithProperties)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clCreateCommandQueueWithProperties");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_99);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clCreateCommandQueueWithProperties = p_Var101;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clCreatePipe",(allocator *)&local_90);
    p_Var102 = (cl_api_clCreatePipe)
               OS::Services_Common::GetFunctionPointer
                         (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var102 == (cl_api_clCreatePipe)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clCreatePipe");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_x00100);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clCreatePipe = p_Var102;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clGetPipeInfo",(allocator *)&local_90);
    p_Var103 = (cl_api_clGetPipeInfo)
               OS::Services_Common::GetFunctionPointer
                         (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var103 == (cl_api_clGetPipeInfo)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clGetPipeInfo");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_x00101);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clGetPipeInfo = p_Var103;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clSVMAlloc",(allocator *)&local_90);
    p_Var104 = (cl_api_clSVMAlloc)
               OS::Services_Common::GetFunctionPointer
                         (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var104 == (cl_api_clSVMAlloc)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clSVMAlloc");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_x00102);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clSVMAlloc = p_Var104;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clSVMFree",(allocator *)&local_90);
    p_Var105 = (cl_api_clSVMFree)
               OS::Services_Common::GetFunctionPointer
                         (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var105 == (cl_api_clSVMFree)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clSVMFree");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_x00103);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clSVMFree = p_Var105;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clEnqueueSVMFree",(allocator *)&local_90);
    p_Var106 = (cl_api_clEnqueueSVMFree)
               OS::Services_Common::GetFunctionPointer
                         (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var106 == (cl_api_clEnqueueSVMFree)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clEnqueueSVMFree");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_x00104);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clEnqueueSVMFree = p_Var106;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clEnqueueSVMMemcpy",(allocator *)&local_90);
    p_Var107 = (cl_api_clEnqueueSVMMemcpy)
               OS::Services_Common::GetFunctionPointer
                         (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var107 == (cl_api_clEnqueueSVMMemcpy)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clEnqueueSVMMemcpy");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_x00105);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clEnqueueSVMMemcpy = p_Var107;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clEnqueueSVMMemFill",(allocator *)&local_90);
    p_Var108 = (cl_api_clEnqueueSVMMemFill)
               OS::Services_Common::GetFunctionPointer
                         (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var108 == (cl_api_clEnqueueSVMMemFill)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clEnqueueSVMMemFill");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_x00106);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clEnqueueSVMMemFill = p_Var108;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clEnqueueSVMMap",(allocator *)&local_90);
    p_Var109 = (cl_api_clEnqueueSVMMap)
               OS::Services_Common::GetFunctionPointer
                         (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var109 == (cl_api_clEnqueueSVMMap)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clEnqueueSVMMap");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_x00107);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clEnqueueSVMMap = p_Var109;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clEnqueueSVMUnmap",(allocator *)&local_90);
    p_Var110 = (cl_api_clEnqueueSVMUnmap)
               OS::Services_Common::GetFunctionPointer
                         (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var110 == (cl_api_clEnqueueSVMUnmap)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clEnqueueSVMUnmap");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_x00108);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clEnqueueSVMUnmap = p_Var110;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string
              ((string *)&local_70,"clCreateSamplerWithProperties",(allocator *)&local_90);
    p_Var111 = (cl_api_clCreateSamplerWithProperties)
               OS::Services_Common::GetFunctionPointer
                         (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var111 == (cl_api_clCreateSamplerWithProperties)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clCreateSamplerWithProperties");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_x00109);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clCreateSamplerWithProperties = p_Var111;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string
              ((string *)&local_70,"clSetKernelArgSVMPointer",(allocator *)&local_90);
    p_Var112 = (cl_api_clSetKernelArgSVMPointer)
               OS::Services_Common::GetFunctionPointer
                         (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var112 == (cl_api_clSetKernelArgSVMPointer)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clSetKernelArgSVMPointer");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_x00110);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clSetKernelArgSVMPointer = p_Var112;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clSetKernelExecInfo",(allocator *)&local_90);
    p_Var113 = (cl_api_clSetKernelExecInfo)
               OS::Services_Common::GetFunctionPointer
                         (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var113 == (cl_api_clSetKernelExecInfo)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clSetKernelExecInfo");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_x00111);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clSetKernelExecInfo = p_Var113;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clCloneKernel",(allocator *)&local_90);
    p_Var114 = (cl_api_clCloneKernel)
               OS::Services_Common::GetFunctionPointer
                         (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var114 == (cl_api_clCloneKernel)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clCloneKernel");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_x00112);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clCloneKernel = p_Var114;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clCreateProgramWithIL",(allocator *)&local_90)
    ;
    p_Var115 = (cl_api_clCreateProgramWithIL)
               OS::Services_Common::GetFunctionPointer
                         (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var115 == (cl_api_clCreateProgramWithIL)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clCreateProgramWithIL");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_x00113);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clCreateProgramWithIL = p_Var115;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string
              ((string *)&local_70,"clEnqueueSVMMigrateMem",(allocator *)&local_90);
    p_Var116 = (cl_api_clEnqueueSVMMigrateMem)
               OS::Services_Common::GetFunctionPointer
                         (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var116 == (cl_api_clEnqueueSVMMigrateMem)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clEnqueueSVMMigrateMem");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_x00114);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clEnqueueSVMMigrateMem = p_Var116;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string
              ((string *)&local_70,"clGetDeviceAndHostTimer",(allocator *)&local_90);
    p_Var117 = (cl_api_clGetDeviceAndHostTimer)
               OS::Services_Common::GetFunctionPointer
                         (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var117 == (cl_api_clGetDeviceAndHostTimer)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clGetDeviceAndHostTimer");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_x00115);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clGetDeviceAndHostTimer = p_Var117;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string((string *)&local_70,"clGetHostTimer",(allocator *)&local_90);
    p_Var118 = (cl_api_clGetHostTimer)
               OS::Services_Common::GetFunctionPointer
                         (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var118 == (cl_api_clGetHostTimer)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clGetHostTimer");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_x00116);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clGetHostTimer = p_Var118;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string
              ((string *)&local_70,"clGetKernelSubGroupInfo",(allocator *)&local_90);
    p_Var119 = (cl_api_clGetKernelSubGroupInfo)
               OS::Services_Common::GetFunctionPointer
                         (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var119 == (cl_api_clGetKernelSubGroupInfo)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clGetKernelSubGroupInfo");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_x00117);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clGetKernelSubGroupInfo = p_Var119;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string
              ((string *)&local_70,"clSetDefaultDeviceCommandQueue",(allocator *)&local_90);
    p_Var120 = (cl_api_clSetDefaultDeviceCommandQueue)
               OS::Services_Common::GetFunctionPointer
                         (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var120 == (cl_api_clSetDefaultDeviceCommandQueue)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clSetDefaultDeviceCommandQueue");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_x00118);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clSetDefaultDeviceCommandQueue = p_Var120;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string
              ((string *)&local_70,"clSetProgramReleaseCallback",(allocator *)&local_90);
    p_Var121 = (cl_api_clSetProgramReleaseCallback)
               OS::Services_Common::GetFunctionPointer
                         (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var121 == (cl_api_clSetProgramReleaseCallback)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clSetProgramReleaseCallback");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_x00119);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clSetProgramReleaseCallback = p_Var121;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string
              ((string *)&local_70,"clSetProgramSpecializationConstant",(allocator *)&local_90);
    p_Var122 = (cl_api_clSetProgramSpecializationConstant)
               OS::Services_Common::GetFunctionPointer
                         (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var122 == (cl_api_clSetProgramSpecializationConstant)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clSetProgramSpecializationConstant");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_x00120);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clSetProgramSpecializationConstant = p_Var122;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string
              ((string *)&local_70,"clCreateBufferWithProperties",(allocator *)&local_90);
    p_Var123 = (cl_api_clCreateBufferWithProperties)
               OS::Services_Common::GetFunctionPointer
                         (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var123 == (cl_api_clCreateBufferWithProperties)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clCreateBufferWithProperties");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_x00121);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clCreateBufferWithProperties = p_Var123;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string
              ((string *)&local_70,"clCreateImageWithProperties",(allocator *)&local_90);
    p_Var124 = (cl_api_clCreateImageWithProperties)
               OS::Services_Common::GetFunctionPointer
                         (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var124 == (cl_api_clCreateImageWithProperties)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clCreateImageWithProperties");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_x00122);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clCreateImageWithProperties = p_Var124;
    }
    pvVar1 = *pLibrary;
    std::__cxx11::string::string
              ((string *)&local_70,"clSetContextDestructorCallback",(allocator *)&local_90);
    p_Var125 = (cl_api_clSetContextDestructorCallback)
               OS::Services_Common::GetFunctionPointer
                         (&this_00->super_Services_Common,pvVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (p_Var125 == (cl_api_clSetContextDestructorCallback)0x0) {
      std::__cxx11::string::string
                ((string *)&local_50,"Couldn\'t get exported function pointer to: ",&local_91);
      std::operator+(&local_90,&local_50,"clSetContextDestructorCallback");
      std::operator+(&local_70,&local_90,"\n");
      log(this,__x_x00123);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (this->m_Dispatch).clSetContextDestructorCallback = p_Var125;
    }
    if (p_Var66 != (cl_api_clEnqueueBarrier)0x0 &&
        (p_Var65 != (cl_api_clEnqueueWaitForEvents)0x0 &&
        (p_Var64 != (cl_api_clEnqueueMarker)0x0 &&
        (p_Var63 != (cl_api_clEnqueueNativeKernel)0x0 &&
        (p_Var62 != (cl_api_clEnqueueTask)0x0 &&
        (p_Var61 != (cl_api_clEnqueueNDRangeKernel)0x0 &&
        (p_Var60 != (cl_api_clEnqueueUnmapMemObject)0x0 &&
        (p_Var59 != (cl_api_clEnqueueMapImage)0x0 &&
        (p_Var58 != (cl_api_clEnqueueMapBuffer)0x0 &&
        (p_Var57 != (cl_api_clEnqueueCopyBufferToImage)0x0 &&
        (p_Var56 != (cl_api_clEnqueueCopyImageToBuffer)0x0 &&
        (p_Var55 != (cl_api_clEnqueueCopyImage)0x0 &&
        (p_Var54 != (cl_api_clEnqueueWriteImage)0x0 &&
        (p_Var53 != (cl_api_clEnqueueReadImage)0x0 &&
        (p_Var52 != (cl_api_clEnqueueCopyBuffer)0x0 &&
        (p_Var51 != (cl_api_clEnqueueWriteBuffer)0x0 &&
        (p_Var50 != (cl_api_clEnqueueReadBuffer)0x0 &&
        (p_Var49 != (cl_api_clFinish)0x0 &&
        (p_Var48 != (cl_api_clFlush)0x0 &&
        (p_Var47 != (cl_api_clGetEventProfilingInfo)0x0 &&
        (p_Var46 != (cl_api_clReleaseEvent)0x0 &&
        (p_Var45 != (cl_api_clRetainEvent)0x0 &&
        (p_Var44 != (cl_api_clGetEventInfo)0x0 &&
        (p_Var43 != (cl_api_clWaitForEvents)0x0 &&
        (p_Var42 != (cl_api_clGetKernelWorkGroupInfo)0x0 &&
        (p_Var41 != (cl_api_clGetKernelInfo)0x0 &&
        (p_Var40 != (cl_api_clSetKernelArg)0x0 &&
        (p_Var39 != (cl_api_clReleaseKernel)0x0 &&
        (p_Var38 != (cl_api_clRetainKernel)0x0 &&
        (p_Var37 != (cl_api_clCreateKernelsInProgram)0x0 &&
        (p_Var36 != (cl_api_clCreateKernel)0x0 &&
        (p_Var35 != (cl_api_clGetProgramBuildInfo)0x0 &&
        (p_Var34 != (cl_api_clGetProgramInfo)0x0 &&
        (p_Var33 != (cl_api_clUnloadCompiler)0x0 &&
        (p_Var32 != (cl_api_clBuildProgram)0x0 &&
        (p_Var31 != (cl_api_clReleaseProgram)0x0 &&
        (p_Var30 != (cl_api_clRetainProgram)0x0 &&
        (p_Var29 != (cl_api_clCreateProgramWithBinary)0x0 &&
        (p_Var28 != (cl_api_clCreateProgramWithSource)0x0 &&
        (p_Var27 != (cl_api_clGetSamplerInfo)0x0 &&
        (p_Var26 != (cl_api_clReleaseSampler)0x0 &&
        (p_Var25 != (cl_api_clRetainSampler)0x0 &&
        (p_Var24 != (cl_api_clCreateSampler)0x0 &&
        (p_Var23 != (cl_api_clGetImageInfo)0x0 &&
        (p_Var22 != (cl_api_clGetMemObjectInfo)0x0 &&
        (p_Var21 != (cl_api_clGetSupportedImageFormats)0x0 &&
        (p_Var20 != (cl_api_clReleaseMemObject)0x0 &&
        (p_Var19 != (cl_api_clRetainMemObject)0x0 &&
        (p_Var18 != (cl_api_clCreateImage3D)0x0 &&
        (p_Var17 != (cl_api_clCreateImage2D)0x0 &&
        (p_Var16 != (cl_api_clCreateBuffer)0x0 &&
        (p_Var15 != (cl_api_clSetCommandQueueProperty)0x0 &&
        (p_Var14 != (cl_api_clGetCommandQueueInfo)0x0 &&
        (p_Var13 != (cl_api_clReleaseCommandQueue)0x0 &&
        (p_Var12 != (cl_api_clRetainCommandQueue)0x0 &&
        (p_Var11 != (cl_api_clCreateCommandQueue)0x0 &&
        (p_Var10 != (cl_api_clGetContextInfo)0x0 &&
        (p_Var9 != (cl_api_clReleaseContext)0x0 &&
        (p_Var8 != (cl_api_clRetainContext)0x0 &&
        (p_Var7 != (cl_api_clCreateContextFromType)0x0 &&
        (p_Var6 != (cl_api_clCreateContext)0x0 &&
        (p_Var5 != (cl_api_clGetDeviceInfo)0x0 &&
        (p_Var4 != (cl_api_clGetDeviceIDs)0x0 &&
        (p_Var3 != (cl_api_clGetPlatformInfo)0x0 && p_Var2 != (cl_api_clGetPlatformIDs)0x0))))))))))
        )))))))))))))))))))))))))))))))))))))))))))))))))))))) {
      return true;
    }
  }
  if (*pLibrary != (void *)0x0) {
    OS::Services_Common::UnloadLibrary(&(this->m_OS).super_Services_Common,pLibrary);
    this->m_OpenCLLibraryHandle = (void *)0x0;
  }
  return false;
}

Assistant:

bool CLIntercept::initDispatch( const std::string& libName )
{
    bool success = true;

    if( success )
    {
        m_OpenCLLibraryHandle = OS().LoadLibrary( libName.c_str() );
        if( m_OpenCLLibraryHandle == NULL )
        {
            log( std::string("Couldn't load library: ") + libName + "\n");
            success = false;
        }
    }

    if( success )
    {
        INIT_EXPORTED_FUNC(clGetPlatformIDs);
        INIT_EXPORTED_FUNC(clGetPlatformInfo);
        INIT_EXPORTED_FUNC(clGetDeviceIDs);
        INIT_EXPORTED_FUNC(clGetDeviceInfo);
        INIT_EXPORTED_FUNC(clCreateContext);
        INIT_EXPORTED_FUNC(clCreateContextFromType);
        INIT_EXPORTED_FUNC(clRetainContext);
        INIT_EXPORTED_FUNC(clReleaseContext);
        INIT_EXPORTED_FUNC(clGetContextInfo);
        INIT_EXPORTED_FUNC(clCreateCommandQueue);
        INIT_EXPORTED_FUNC(clRetainCommandQueue);
        INIT_EXPORTED_FUNC(clReleaseCommandQueue);
        INIT_EXPORTED_FUNC(clGetCommandQueueInfo);
        INIT_EXPORTED_FUNC(clSetCommandQueueProperty);
        INIT_EXPORTED_FUNC(clCreateBuffer);
        INIT_EXPORTED_FUNC(clCreateImage2D);
        INIT_EXPORTED_FUNC(clCreateImage3D);
        INIT_EXPORTED_FUNC(clRetainMemObject);
        INIT_EXPORTED_FUNC(clReleaseMemObject);
        INIT_EXPORTED_FUNC(clGetSupportedImageFormats);
        INIT_EXPORTED_FUNC(clGetMemObjectInfo);
        INIT_EXPORTED_FUNC(clGetImageInfo);
        INIT_EXPORTED_FUNC(clCreateSampler);
        INIT_EXPORTED_FUNC(clRetainSampler);
        INIT_EXPORTED_FUNC(clReleaseSampler);
        INIT_EXPORTED_FUNC(clGetSamplerInfo);
        INIT_EXPORTED_FUNC(clCreateProgramWithSource);
        INIT_EXPORTED_FUNC(clCreateProgramWithBinary);
        INIT_EXPORTED_FUNC(clRetainProgram);
        INIT_EXPORTED_FUNC(clReleaseProgram);
        INIT_EXPORTED_FUNC(clBuildProgram);
        INIT_EXPORTED_FUNC(clUnloadCompiler);
        INIT_EXPORTED_FUNC(clGetProgramInfo);
        INIT_EXPORTED_FUNC(clGetProgramBuildInfo);
        INIT_EXPORTED_FUNC(clCreateKernel);
        INIT_EXPORTED_FUNC(clCreateKernelsInProgram);
        INIT_EXPORTED_FUNC(clRetainKernel);
        INIT_EXPORTED_FUNC(clReleaseKernel);
        INIT_EXPORTED_FUNC(clSetKernelArg);
        INIT_EXPORTED_FUNC(clGetKernelInfo);
        INIT_EXPORTED_FUNC(clGetKernelWorkGroupInfo);
        INIT_EXPORTED_FUNC(clWaitForEvents);
        INIT_EXPORTED_FUNC(clGetEventInfo);
        INIT_EXPORTED_FUNC(clRetainEvent);
        INIT_EXPORTED_FUNC(clReleaseEvent);
        INIT_EXPORTED_FUNC(clGetEventProfilingInfo);
        INIT_EXPORTED_FUNC(clFlush);
        INIT_EXPORTED_FUNC(clFinish);
        INIT_EXPORTED_FUNC(clEnqueueReadBuffer);
        INIT_EXPORTED_FUNC(clEnqueueWriteBuffer);
        INIT_EXPORTED_FUNC(clEnqueueCopyBuffer);
        INIT_EXPORTED_FUNC(clEnqueueReadImage);
        INIT_EXPORTED_FUNC(clEnqueueWriteImage);
        INIT_EXPORTED_FUNC(clEnqueueCopyImage);
        INIT_EXPORTED_FUNC(clEnqueueCopyImageToBuffer);
        INIT_EXPORTED_FUNC(clEnqueueCopyBufferToImage);
        INIT_EXPORTED_FUNC(clEnqueueMapBuffer);
        INIT_EXPORTED_FUNC(clEnqueueMapImage);
        INIT_EXPORTED_FUNC(clEnqueueUnmapMemObject);
        INIT_EXPORTED_FUNC(clEnqueueNDRangeKernel);
        INIT_EXPORTED_FUNC(clEnqueueTask);
        INIT_EXPORTED_FUNC(clEnqueueNativeKernel);
        INIT_EXPORTED_FUNC(clEnqueueMarker);
        INIT_EXPORTED_FUNC(clEnqueueWaitForEvents);
        INIT_EXPORTED_FUNC(clEnqueueBarrier);

        bool    savedSuccess = success;

        INIT_EXPORTED_FUNC(clGetExtensionFunctionAddress);

        // cl_khr_gl_sharing (optional)
        // The entry points for this extension are exported from the ICD
        // loader even though they are extension APIs.
        INIT_EXPORTED_FUNC( clGetGLContextInfoKHR );
#if defined(_WIN32) || defined(__linux__) || defined(__FreeBSD__)
        INIT_EXPORTED_FUNC( clCreateFromGLBuffer );
        INIT_EXPORTED_FUNC( clCreateFromGLTexture );
        INIT_EXPORTED_FUNC( clCreateFromGLTexture2D );
        INIT_EXPORTED_FUNC( clCreateFromGLTexture3D );
        INIT_EXPORTED_FUNC( clCreateFromGLRenderbuffer );
        INIT_EXPORTED_FUNC( clGetGLObjectInfo );
        INIT_EXPORTED_FUNC( clGetGLTextureInfo );   // OpenCL 1.2
        INIT_EXPORTED_FUNC( clEnqueueAcquireGLObjects );
        INIT_EXPORTED_FUNC( clEnqueueReleaseGLObjects );
#endif

        // OpenCL 1.1 Entry Points (optional)
        INIT_EXPORTED_FUNC(clSetEventCallback);
        INIT_EXPORTED_FUNC(clCreateSubBuffer);
        INIT_EXPORTED_FUNC(clSetMemObjectDestructorCallback);
        INIT_EXPORTED_FUNC(clCreateUserEvent);
        INIT_EXPORTED_FUNC(clSetUserEventStatus);
        INIT_EXPORTED_FUNC(clEnqueueReadBufferRect);
        INIT_EXPORTED_FUNC(clEnqueueWriteBufferRect);
        INIT_EXPORTED_FUNC(clEnqueueCopyBufferRect);

        // OpenCL 1.2 Entry Points (optional)
        INIT_EXPORTED_FUNC(clCreateSubDevices);
        INIT_EXPORTED_FUNC(clRetainDevice);
        INIT_EXPORTED_FUNC(clReleaseDevice);
        INIT_EXPORTED_FUNC(clCreateImage);
        INIT_EXPORTED_FUNC(clCreateProgramWithBuiltInKernels);
        INIT_EXPORTED_FUNC(clCompileProgram);
        INIT_EXPORTED_FUNC(clLinkProgram);
        INIT_EXPORTED_FUNC(clUnloadPlatformCompiler);
        INIT_EXPORTED_FUNC(clGetKernelArgInfo);
        INIT_EXPORTED_FUNC(clEnqueueFillBuffer);
        INIT_EXPORTED_FUNC(clEnqueueFillImage);
        INIT_EXPORTED_FUNC(clEnqueueMigrateMemObjects);
        INIT_EXPORTED_FUNC(clEnqueueMarkerWithWaitList);
        INIT_EXPORTED_FUNC(clEnqueueBarrierWithWaitList);
        INIT_EXPORTED_FUNC(clGetExtensionFunctionAddressForPlatform);

        // OpenCL 2.0 Entry Points (optional)
        INIT_EXPORTED_FUNC(clCreateCommandQueueWithProperties);
        INIT_EXPORTED_FUNC(clCreatePipe);
        INIT_EXPORTED_FUNC(clGetPipeInfo);
        INIT_EXPORTED_FUNC(clSVMAlloc);
        INIT_EXPORTED_FUNC(clSVMFree);
        INIT_EXPORTED_FUNC(clEnqueueSVMFree);
        INIT_EXPORTED_FUNC(clEnqueueSVMMemcpy);
        INIT_EXPORTED_FUNC(clEnqueueSVMMemFill);
        INIT_EXPORTED_FUNC(clEnqueueSVMMap);
        INIT_EXPORTED_FUNC(clEnqueueSVMUnmap);
        INIT_EXPORTED_FUNC(clCreateSamplerWithProperties);
        INIT_EXPORTED_FUNC(clSetKernelArgSVMPointer);
        INIT_EXPORTED_FUNC(clSetKernelExecInfo);

        // OpenCL 2.1 Entry Points (optional)
        INIT_EXPORTED_FUNC(clCloneKernel);
        INIT_EXPORTED_FUNC(clCreateProgramWithIL);
        INIT_EXPORTED_FUNC(clEnqueueSVMMigrateMem);
        INIT_EXPORTED_FUNC(clGetDeviceAndHostTimer);
        INIT_EXPORTED_FUNC(clGetHostTimer);
        INIT_EXPORTED_FUNC(clGetKernelSubGroupInfo);
        INIT_EXPORTED_FUNC(clSetDefaultDeviceCommandQueue);

        // OpenCL 2.2 Entry Points (optional)
        INIT_EXPORTED_FUNC(clSetProgramReleaseCallback);
        INIT_EXPORTED_FUNC(clSetProgramSpecializationConstant);

        // OpenCL 3.0 Entry Points (optional)
        INIT_EXPORTED_FUNC(clCreateBufferWithProperties);
        INIT_EXPORTED_FUNC(clCreateImageWithProperties);
        INIT_EXPORTED_FUNC(clSetContextDestructorCallback);

        success = savedSuccess;
    }

    if( !success )
    {
        if( m_OpenCLLibraryHandle != NULL )
        {
            OS().UnloadLibrary( m_OpenCLLibraryHandle );
            m_OpenCLLibraryHandle = NULL;
        }
    }

    return success;
}